

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

int capnp::_::OrphanBuilder::copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  undefined1 auVar1 [16];
  int iVar2;
  undefined8 extraout_RAX;
  void *in_RCX;
  CapTableBuilder *in_RDX;
  uint amount;
  ulong in_R8;
  word *result;
  ulong uVar3;
  AllocateResult AVar4;
  
  *(undefined8 *)(dst + 0x10) = 0;
  *(undefined8 *)(dst + 0x18) = 0;
  *(undefined8 *)dst = 0;
  *(undefined8 *)(dst + 8) = 0;
  if (in_R8 < 0x20000000) {
    amount = (int)in_R8 + 7U >> 3;
    if (src == (EVP_PKEY_CTX *)0x0) {
      if (*(int *)(dst + 4) != 0 || *(int *)dst != 0) {
        WireHelpers::zeroObject((SegmentBuilder *)0x0,in_RDX,(WirePointer *)dst);
      }
      if ((long)((_DAT_00000018 * 8 + _DAT_00000010) - _DAT_00000028) >> 3 < (long)(ulong)amount) {
        uVar3 = 0;
      }
      else {
        uVar3 = _DAT_00000028;
        _DAT_00000028 = (ulong)amount * 8 + _DAT_00000028;
      }
      iVar2 = ((uint)(uVar3 - (long)dst >> 1) & 0xfffffffc) - 3;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar3;
      AVar4 = (AllocateResult)(auVar1 << 0x40);
    }
    else {
      AVar4 = BuilderArena::allocate((BuilderArena *)src,amount);
      iVar2 = -3;
    }
    *(int *)dst = iVar2;
    *(int *)(dst + 4) = (int)in_R8 * 8 + 2;
    if (in_R8 != 0) {
      memcpy(AVar4.words,in_RCX,in_R8);
    }
    *(SegmentBuilder **)(dst + 8) = AVar4.segment;
    *(CapTableBuilder **)(dst + 0x10) = in_RDX;
    *(word **)(dst + 0x18) = AVar4.words;
    return (int)dst;
  }
  anon_func::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)dst);
  if (*(long *)(dst + 8) != 0) {
    euthanize((OrphanBuilder *)dst);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

OrphanBuilder OrphanBuilder::copy(
    BuilderArena* arena, CapTableBuilder* capTable, Data::Reader copyFrom) {
  OrphanBuilder result;
  auto allocation = WireHelpers::setDataPointer(
      result.tagAsPtr(), nullptr, capTable, copyFrom, arena);
  result.segment = allocation.segment;
  result.capTable = capTable;
  result.location = reinterpret_cast<word*>(allocation.value.begin());
  return result;
}